

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigcache.cpp
# Opt level: O3

void __thiscall
SignatureCache::ComputeEntryECDSA
          (SignatureCache *this,uint256 *entry,uint256 *hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CPubKey *pubkey)

{
  uchar *data;
  CSHA256 *pCVar1;
  byte bVar2;
  long lVar3;
  size_t len;
  long in_FS_OFFSET;
  CSHA256 hasher;
  CSHA256 CStack_88;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = &CStack_88;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pCVar1 = *(undefined8 *)(this->m_salted_hasher_ecdsa).s;
    this = (SignatureCache *)((this->m_salted_hasher_ecdsa).s + 2);
    pCVar1 = (CSHA256 *)((long)pCVar1 + 8);
  }
  pCVar1 = CSHA256::Write(&CStack_88,(uchar *)hash,0x20);
  len = 0x21;
  if ((pubkey->vch[0] & 0xfe) != 2) {
    bVar2 = pubkey->vch[0] - 4;
    if (bVar2 < 4) {
      len = *(size_t *)(&DAT_00808f98 + (ulong)bVar2 * 8);
    }
    else {
      len = 0;
    }
  }
  pCVar1 = CSHA256::Write(pCVar1,pubkey->vch,len);
  data = (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pCVar1 = CSHA256::Write(pCVar1,data,
                          (long)(vchSig->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)data);
  CSHA256::Finalize(pCVar1,(uchar *)entry);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SignatureCache::ComputeEntryECDSA(uint256& entry, const uint256& hash, const std::vector<unsigned char>& vchSig, const CPubKey& pubkey) const
{
    CSHA256 hasher = m_salted_hasher_ecdsa;
    hasher.Write(hash.begin(), 32).Write(pubkey.data(), pubkey.size()).Write(vchSig.data(), vchSig.size()).Finalize(entry.begin());
}